

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

type __thiscall
llvm::yaml::yamlize<llvm::DWARFYAML::LineTableOpcode,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,LineTableOpcode *Val,bool param_3,EmptyContext *Ctx)

{
  undefined7 in_register_00000009;
  EmptyContext *Ctx_local;
  bool param_2_local;
  LineTableOpcode *Val_local;
  IO *io_local;
  
  (**(code **)(*(long *)this + 0x68))();
  detail::doMapping<llvm::DWARFYAML::LineTableOpcode>
            ((IO *)this,(LineTableOpcode *)io,(EmptyContext *)CONCAT71(in_register_00000009,param_3)
            );
  (**(code **)(*(long *)this + 0x70))();
  return;
}

Assistant:

typename std::enable_if<unvalidatedMappingTraits<T, Context>::value, void>::type
yamlize(IO &io, T &Val, bool, Context &Ctx) {
  if (has_FlowTraits<MappingTraits<T>>::value) {
    io.beginFlowMapping();
    detail::doMapping(io, Val, Ctx);
    io.endFlowMapping();
  } else {
    io.beginMapping();
    detail::doMapping(io, Val, Ctx);
    io.endMapping();
  }
}